

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O3

string * fs_generate_random_alphanumeric_string_abi_cxx11_
                   (string *__return_storage_ptr__,size_type len)

{
  long lVar1;
  pointer pcVar2;
  result_type rVar3;
  size_type sVar4;
  long *in_FS_OFFSET;
  uniform_int_distribution<unsigned_long> dist;
  uniform_int_distribution<unsigned_long> local_40;
  
  lVar1 = *in_FS_OFFSET;
  if (*(char *)(lVar1 + -8) == '\0') {
    fs_random_generator<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
              ();
    *(undefined1 *)(lVar1 + -8) = 1;
  }
  local_40._M_param._M_a = 0;
  local_40._M_param._M_b = 0x3d;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)len);
  if (len != 0) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar4 = 0;
    do {
      rVar3 = std::uniform_int_distribution<unsigned_long>::operator()
                        (&local_40,
                         (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                          *)(lVar1 + -0x1390),&local_40._M_param);
      pcVar2[sVar4] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[rVar3];
      sVar4 = sVar4 + 1;
    } while (len != sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_generate_random_alphanumeric_string(const std::string::size_type len)
{
#ifdef __cpp_deduction_guides
  constexpr std::string_view chars =
      "0123456789"
      "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
      "abcdefghijklmnopqrstuvwxyz";
  thread_local auto rng = fs_random_generator<>();
  auto dist = std::uniform_int_distribution<std::string::size_type>(0, chars.length() - 1);
  auto result = std::string(len, '\0');
  std::generate_n(std::begin(result), len, [&]() { return chars[dist(rng)]; });
  return result;
#else
  fs_print_error("" , __func__, std::make_error_code(std::errc::function_not_supported));
  return {};
#endif
}